

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::RunContext::handleExpr
          (RunContext *this,AssertionInfo *info,ITransientExpression *expr,
          AssertionReaction *reaction)

{
  byte bVar1;
  bool bVar2;
  RunContext *in_RCX;
  ITransientExpression *in_RDX;
  RunContext *in_RSI;
  RunContext *in_RDI;
  undefined1 uVar3;
  bool result;
  bool negated;
  bool in_stack_000000f7;
  ITransientExpression *in_stack_000000f8;
  OfType in_stack_00000104;
  AssertionInfo *in_stack_00000108;
  RunContext *in_stack_00000110;
  undefined6 in_stack_ffffffffffffffd8;
  
  bVar1 = isFalseTest(*(int *)(in_RSI->m_lastResult).storage);
  bVar2 = ITransientExpression::getResult(in_RDX);
  uVar3 = bVar2 != (bool)(bVar1 & 1);
  if ((bool)uVar3) {
    if ((in_RDI->m_includeSuccessfulResults & 1U) == 0) {
      assertionPassed(in_RDI);
    }
    else {
      reportExpr(in_stack_00000110,in_stack_00000108,in_stack_00000104,in_stack_000000f8,
                 in_stack_000000f7);
    }
  }
  else {
    reportExpr(in_stack_00000110,in_stack_00000108,in_stack_00000104,in_stack_000000f8,
               in_stack_000000f7);
    populateReaction(in_RCX,(AssertionReaction *)
                            CONCAT17(bVar1,CONCAT16(uVar3,in_stack_ffffffffffffffd8)));
  }
  resetAssertionInfo(in_RSI);
  return;
}

Assistant:

void RunContext::handleExpr(
        AssertionInfo const& info,
        ITransientExpression const& expr,
        AssertionReaction& reaction
    ) {
        bool negated = isFalseTest( info.resultDisposition );
        bool result = expr.getResult() != negated;

        if( result ) {
            if (!m_includeSuccessfulResults) {
                assertionPassed();
            }
            else {
                reportExpr(info, ResultWas::Ok, &expr, negated);
            }
        }
        else {
            reportExpr(info, ResultWas::ExpressionFailed, &expr, negated );
            populateReaction( reaction );
        }
        resetAssertionInfo();
    }